

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

void __thiscall
FascodeUtil::msg::_print
          (msg *this,ostream *out_stream,string *appname,string *character,string *label,
          COLOR_TYPE color,int numberspace,string *message)

{
  string *out_stream_00;
  ostream *poVar1;
  string local_78;
  string local_58;
  COLOR_TYPE local_34;
  string *psStack_30;
  COLOR_TYPE color_local;
  string *label_local;
  string *character_local;
  string *appname_local;
  ostream *out_stream_local;
  msg *this_local;
  
  local_34 = color;
  psStack_30 = label;
  label_local = character;
  character_local = appname;
  appname_local = (string *)out_stream;
  out_stream_local = (ostream *)this;
  poVar1 = std::operator<<(out_stream,"\x1b[36m[");
  poVar1 = std::operator<<(poVar1,(string *)appname);
  std::operator<<(poVar1,"]\x1b[m ");
  out_stream_00 = appname_local;
  std::__cxx11::string::string((string *)&local_58,(string *)character);
  std::__cxx11::string::string((string *)&local_78,(string *)label);
  _echo_type(this,(ostream *)out_stream_00,&local_58,&local_78,numberspace,local_34);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  poVar1 = std::operator<<((ostream *)appname_local,(string *)message);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void msg::_print(std::ostream& out_stream,std::string appname,std::string character,std::string label,COLOR_TYPE color,int numberspace,std::string message){

        out_stream << "\e[36m[" << appname << "]\e[m ";
        _echo_type(out_stream,character,label,numberspace,color);
        out_stream << message << std::endl;
    }